

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

int hfile_oflags(char *mode)

{
  char cVar1;
  char *local_20;
  char *s;
  int flags;
  int rdwr;
  char *mode_local;
  
  s._4_4_ = 0;
  s._0_4_ = 0;
  for (local_20 = mode; *local_20 != '\0'; local_20 = local_20 + 1) {
    cVar1 = *local_20;
    if (cVar1 == '+') {
      s._4_4_ = 2;
    }
    else if (cVar1 == 'a') {
      s._4_4_ = 1;
      s._0_4_ = (uint)s | 0x440;
    }
    else if (cVar1 == 'r') {
      s._4_4_ = 0;
    }
    else if (cVar1 == 'w') {
      s._4_4_ = 1;
      s._0_4_ = (uint)s | 0x240;
    }
  }
  return s._4_4_ | (uint)s;
}

Assistant:

int hfile_oflags(const char *mode)
{
    int rdwr = 0, flags = 0;
    const char *s;
    for (s = mode; *s; s++)
        switch (*s) {
        case 'r': rdwr = O_RDONLY;  break;
        case 'w': rdwr = O_WRONLY; flags |= O_CREAT | O_TRUNC;  break;
        case 'a': rdwr = O_WRONLY; flags |= O_CREAT | O_APPEND;  break;
        case '+': rdwr = O_RDWR;  break;
        default:  break;
        }

#ifdef O_BINARY
    flags |= O_BINARY;
#endif

    return rdwr | flags;
}